

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
IntegrateBlock(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
               *this,char *blockAddress,PageSegment *segment,Recycler *recycler)

{
  BOOL BVar1;
  uint uVar2;
  uint uVar3;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  Recycler *recycler_local;
  PageSegment *segment_local;
  char *blockAddress_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  this_00 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)GetUnusedHeapBlock(this);
  if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    BVar1 = SmallHeapBlockT<MediumAllocationBlockAttributes>::SetPage
                      (this_00,blockAddress,segment,recycler);
    if (BVar1 == 0) {
      FreeHeapBlock(this,(SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                         this_00);
      this_local._7_1_ = false;
    }
    else {
      SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::SetNextBlock
                ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_00,
                 &this->fullBlockList->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>)
      ;
      this->fullBlockList =
           (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)this_00;
      (this->super_HeapBucket).heapBlockCount = (this->super_HeapBucket).heapBlockCount + 1;
      uVar2 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAndClearLastFreeCount(this_00);
      uVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectSize(this_00);
      (recycler->autoHeap).uncollectedAllocBytes =
           (ulong)(uVar2 * uVar3) + (recycler->autoHeap).uncollectedAllocBytes;
      uVar2 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectSize(this_00);
      uVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectCount(this_00);
      RecyclerMemoryTracking::ReportAllocation(recycler,blockAddress,(ulong)(uVar2 * uVar3));
      HeapBlock::IsLargeHeapBlock((HeapBlock *)this_00);
      SmallHeapBlockT<MediumAllocationBlockAttributes>::SetIsIntegratedBlock(this_00);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
HeapBucketT<TBlockType>::IntegrateBlock(char * blockAddress, PageSegment * segment, Recycler * recycler)
{
    // Add a new heap block
    TBlockType * heapBlock = GetUnusedHeapBlock();
    if (heapBlock == nullptr)
    {
        return false;
    }

    // TODO: Consider supporting guard pages for this codepath
    if (!heapBlock->SetPage(blockAddress, segment, recycler))
    {
        FreeHeapBlock(heapBlock);
        return false;
    }

    heapBlock->SetNextBlock(this->fullBlockList);
    this->fullBlockList = heapBlock;

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    this->heapBlockCount++;
#endif

    recycler->autoHeap.uncollectedAllocBytes += heapBlock->GetAndClearLastFreeCount() * heapBlock->GetObjectSize();
    RecyclerMemoryTracking::ReportAllocation(recycler, blockAddress, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    RECYCLER_PERF_COUNTER_ADD(LiveObject,heapBlock->GetObjectCount());
    RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());

    if (heapBlock->IsLargeHeapBlock())
    {
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockLiveObject,heapBlock->GetObjectCount());
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockLiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    }
    else
    {
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject,heapBlock->GetObjectCount());
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, heapBlock->GetObjectSize() * heapBlock->GetObjectCount());
    }

#if DBG
    heapBlock->SetIsIntegratedBlock();
#endif

    return true;
}